

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

bool __thiscall Parser::checkEquLabel(Parser *this)

{
  pointer pCVar1;
  bool bVar2;
  Token *startToken;
  Token *pTVar3;
  Token *pTVar4;
  char *text;
  uint uVar5;
  ValueType *symbol;
  
  updateFileInfo(this);
  startToken = Tokenizer::peekToken
                         ((this->entries).
                          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
  if (startToken->type != Identifier) {
    return false;
  }
  pTVar3 = Tokenizer::peekToken
                     ((this->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,1);
  uVar5 = (uint)(pTVar3->type == Colon);
  pTVar3 = Tokenizer::peekToken
                     ((this->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,uVar5 + 1);
  if (pTVar3->type == Equ) {
    pTVar3 = Tokenizer::peekToken
                       ((this->entries).
                        super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,uVar5 + 2);
    if (pTVar3->type == EquValue) {
      pTVar3 = Tokenizer::peekToken
                         ((this->entries).
                          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
      if (*(__index_type *)
           ((long)&(pTVar3->value).
                   super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                   .
                   super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                   .super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
           + 0x20) != '\x04') {
        __assert_fail("std::holds_alternative<Identifier>(value)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                      ,0x4d,"const Identifier &Token::identifierValue() const");
      }
      pTVar4 = Tokenizer::peekToken
                         ((this->entries).
                          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,uVar5 + 2);
      if (*(__index_type *)
           ((long)&(pTVar4->value).
                   super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                   .
                   super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                   .super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                   super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
           + 0x20) != '\x03') {
        __assert_fail("std::holds_alternative<StringLiteral>(value)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                      ,0x53,"const StringLiteral &Token::stringValue() const");
      }
      Tokenizer::eatTokens
                ((this->entries).
                 super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].tokenizer,uVar5 + 3);
      pCVar1 = (this->conditionStack).
               super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pCVar1[-1].inTrueBlock != true) {
        return true;
      }
      if (pCVar1[-1].inUnknownBlock == true) {
        printError<>(this,startToken,"equ not allowed inside of block with non-trivial condition");
        return true;
      }
      symbol = &pTVar3->value;
      if (this->initializingMacro == true) {
        std::
        _Rb_tree<Identifier,Identifier,std::_Identity<Identifier>,std::less<Identifier>,std::allocator<Identifier>>
        ::_M_insert_unique<Identifier_const&>
                  ((_Rb_tree<Identifier,Identifier,std::_Identity<Identifier>,std::less<Identifier>,std::allocator<Identifier>>
                    *)&this->macroLabels,(Identifier *)symbol);
        return true;
      }
      bVar2 = SymbolTable::isValidSymbolName((Identifier *)symbol);
      if (bVar2) {
        bVar2 = SymbolTable::symbolExists
                          (&Global.symbolTable,(Identifier *)symbol,Global.FileInfo.FileNum,
                           Global.Section);
        if (!bVar2) {
          addEquation(this,startToken,(Identifier *)symbol,(string *)&pTVar4->value);
          return true;
        }
        text = "Equation name \"%s\" already defined";
      }
      else {
        text = "Invalid equation name \"%s\"";
      }
      printError<Identifier>(this,startToken,text,(Identifier *)symbol);
      return true;
    }
  }
  return false;
}

Assistant:

bool Parser::checkEquLabel()
{
	updateFileInfo();

	const Token& start = peekToken();
	if (start.type == TokenType::Identifier)
	{
		int pos = 1;
		if (peekToken(pos).type == TokenType::Colon)
			pos++;

		if (peekToken(pos).type == TokenType::Equ &&
			peekToken(pos+1).type == TokenType::EquValue)
		{
			const Identifier &name = peekToken(0).identifierValue();
			const StringLiteral &value = peekToken(pos+1).stringValue();
			eatTokens(pos+2);

			// skip the equ if it's inside a false conditional block
			if (!isInsideTrueBlock())
				return true;

			// equs can't be inside blocks whose condition can only be
			// evaluated during validation
			if (isInsideUnknownBlock())
			{
				printError(start, "equ not allowed inside of block with non-trivial condition");
				return true;
			}

			// when parsing a macro, just remember the equ name
			if (initializingMacro)
			{
				macroLabels.insert(name);
				return true;
			}

			if (!Global.symbolTable.isValidSymbolName(name))
			{
				printError(start, "Invalid equation name \"%s\"",name);
				return true;
			}

			if (Global.symbolTable.symbolExists(name,Global.FileInfo.FileNum,Global.Section))
			{
				printError(start, "Equation name \"%s\" already defined",name);
				return true;
			}

			addEquation(start,name,value.string());
			return true;
		}
	}

	return false;
}